

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::Matcher<fmt::v5::basic_string_view<wchar_t>_>::Matcher
          (Matcher<fmt::v5::basic_string_view<wchar_t>_> *this,basic_string_view<wchar_t> value)

{
  basic_string_view<wchar_t> x;
  EqMatcher<fmt::v5::basic_string_view<wchar_t>_> *in_RSI;
  Matcher<fmt::v5::basic_string_view<wchar_t>_> *in_RDI;
  Matcher<fmt::v5::basic_string_view<wchar_t>_> *in_stack_ffffffffffffff78;
  
  internal::MatcherBase<fmt::v5::basic_string_view<wchar_t>_>::MatcherBase
            ((MatcherBase<fmt::v5::basic_string_view<wchar_t>_> *)0x128808);
  (in_RDI->super_MatcherBase<fmt::v5::basic_string_view<wchar_t>_>)._vptr_MatcherBase =
       (_func_int **)&PTR__Matcher_002699f0;
  x.size_ = (size_t)in_RDI;
  x.data_ = (wchar_t *)in_stack_ffffffffffffff78;
  Eq<fmt::v5::basic_string_view<wchar_t>>(x);
  internal::EqMatcher::operator_cast_to_Matcher(in_RSI);
  operator=(in_RDI,in_stack_ffffffffffffff78);
  ~Matcher((Matcher<fmt::v5::basic_string_view<wchar_t>_> *)0x12887c);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }